

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int mainprog(nccfgstate *state)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__s;
  
  iVar2 = state->argc;
  cVar1 = '\0';
  if (1 < (long)iVar2) {
    cVar1 = mcplcfg_decode_modeflag(state->argv[1]);
  }
  iVar3 = 2;
  if (cVar1 == 's') {
    iVar3 = 99;
  }
  if ((((int)(cVar1 == 's' | 2) <= iVar2) && (cVar1 != '\0')) && (iVar2 <= iVar3)) {
    if (cVar1 == 's') {
      iVar2 = mcplcfg_mode_show(state,state->argv + 2,state->argv + iVar2);
      return iVar2;
    }
    if (cVar1 == 'h') {
      mcplcfg_show_help(state);
    }
    else {
      if (cVar1 == 'v') {
        __s = "2.0.0";
      }
      else {
        if (cVar1 != 'i') {
          mcplcfg_show_summary(state);
          return 0;
        }
        __s = "2000000";
      }
      puts(__s);
    }
    return 0;
  }
  mainprog_cold_1();
  return 1;
}

Assistant:

int mainprog( nccfgstate* state )
{
  int argc = state->argc;
  char mode = ( argc >= 2
                ? mcplcfg_decode_modeflag(state->argv[1])
                : MCPLCFG_MODE_INVALID );

  int min_nargs = mode == MCPLCFG_MODE_SHOW ? 3 : 2;
  int max_nargs = mode == MCPLCFG_MODE_SHOW ? 99 : 2;
  if ( mode == MCPLCFG_MODE_INVALID || argc > max_nargs || argc < min_nargs ) {
    mcu8str cmdname = mcplcfg_thiscmdname(state);
    fprintf(stderr,"%s: error: Missing or invalid arguments."
            " Run with --help for usage instructions.\n",cmdname.c_str);
    mcu8str_dealloc(&cmdname);
    return 1;
  }

  if ( mode == MCPLCFG_MODE_SHOW ) {
    const char ** arg0 = (const char**)&(state->argv[0]);
    const char ** argBegin = arg0 + 2;
    const char ** argEnd = arg0 + argc;
    int ec = mcplcfg_mode_show( state, argBegin, argEnd );
    return ec;
  }

  if ( mode == MCPLCFG_MODE_INTVERSION ) {
    printf("%s\n",mcplcfg_const_intversion());
  } else if ( mode == MCPLCFG_MODE_VERSION ) {
    printf("%s\n",mcplcfg_const_version());
  } else if ( mode == MCPLCFG_MODE_HELP ) {
    mcplcfg_show_help(state);
  } else {
    assert( mode == MCPLCFG_MODE_SUMMARY );
    mcplcfg_show_summary(state);
  }

  return 0;
}